

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O2

int fits_unset_compression_request(fitsfile *fptr,int *status)

{
  FITSfile *pFVar1;
  long lVar2;
  
  pFVar1 = fptr->Fptr;
  pFVar1->request_compress_type = 0;
  pFVar1->request_quantize_level = 0.0;
  pFVar1->request_quantize_method = 0;
  pFVar1->request_dither_seed = 0;
  pFVar1->request_lossy_int_compress = 0;
  pFVar1->request_huge_hdu = 0;
  pFVar1->request_hcomp_scale = 0.0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    pFVar1->request_tilesize[lVar2] = 0;
  }
  return *status;
}

Assistant:

int fits_unset_compression_request(
      fitsfile *fptr,
      int *status) 
{
    int ii;

    (fptr->Fptr)->request_compress_type = 0;
    (fptr->Fptr)->request_quantize_level = 0;
    (fptr->Fptr)->request_quantize_method = 0;
    (fptr->Fptr)->request_dither_seed = 0; 
    (fptr->Fptr)->request_hcomp_scale = 0;
    (fptr->Fptr)->request_lossy_int_compress = 0;
    (fptr->Fptr)->request_huge_hdu = 0;

    for (ii = 0; ii < MAX_COMPRESS_DIM; ii++)
    {
        (fptr->Fptr)->request_tilesize[ii] = 0;
    }

    return(*status);
}